

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_test.cc
# Opt level: O1

void __thiscall
IntegrationTest_TestMultipartUpload_smallfile_Test::
~IntegrationTest_TestMultipartUpload_smallfile_Test
          (IntegrationTest_TestMultipartUpload_smallfile_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(IntegrationTest, TestMultipartUpload_smallfile)
{
	Qiniu_Client client;
	Qiniu_Zero(client);

	Qiniu_Error err;
	Qiniu_Mac mac = {QINIU_ACCESS_KEY, QINIU_SECRET_KEY}; // set by env "source test-env.sh"
	Qiniu_Client_InitMacAuth(&client, 1024, &mac);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	char smallFileKey[100];
	Qiniu_snprintf(smallFileKey, 100, "smallkey_%d", rand());

	const char *keys[] = {
		smallFileKey, // normal keyname
		"",			  // empty string keyname
		NULL};		  // no keyname, determined by server(eg:hash as keyname)
	for (int i = 0; i < sizeof(keys) / sizeof(keys[0]); i++)
	{
		const char *inputKey = keys[i];

		// step1: delete  file if exist
		if (inputKey != NULL)
		{
			Qiniu_RS_Delete(&client, Test_bucket, inputKey);
		}
		// step2: upload file
		const char *returnKey = putFile_multipart(Test_bucket, inputKey, "txt", __FILE__, (4 << 20), &mac); // upload current file

		// step3: stat file
		Qiniu_RS_StatRet statResult;
		err = Qiniu_RS_Stat(&client, &statResult, Test_bucket, returnKey);
		EXPECT_EQ(err.code, 200);
		EXPECT_STREQ(statResult.mimeType, "txt");

		// step4: delete file
		err = Qiniu_RS_Delete(&client, Test_bucket, returnKey);
		EXPECT_EQ(err.code, 200);
	}

	Qiniu_Client_Cleanup(&client);
}